

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O0

void __thiscall
PyServerDMLSession::on_invalid_message(PyServerDMLSession *this,InvalidDMLMessageErrorCode error)

{
  bool bVar1;
  object local_48;
  object o;
  handle local_30;
  function overload;
  gil_scoped_acquire gil;
  InvalidDMLMessageErrorCode error_local;
  PyServerDMLSession *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<ki::protocol::net::ServerDMLSession>
            ((pybind11 *)&local_30,&this->super_ServerDMLSession,"on_invalid_message");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_30);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_48,(InvalidDMLMessageErrorCode *)&local_30);
    pybind11::detail::cast_safe<void>(&local_48);
    pybind11::object::~object(&local_48);
  }
  pybind11::function::~function((function *)&local_30);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    ki::protocol::net::DMLSession::on_invalid_message
              ((DMLSession *)&(this->super_ServerDMLSession).super_ServerSession.field_0x8,error);
  }
  return;
}

Assistant:

void on_invalid_message(ki::protocol::net::InvalidDMLMessageErrorCode error) override
    {
        PYBIND11_OVERLOAD(
            void, ki::protocol::net::ServerDMLSession,
            on_invalid_message, error);
    }